

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

VP8StatusCode DecodePartition0(WebPIDecoder *idec)

{
  int iVar1;
  DecState DVar2;
  size_t sVar3;
  VP8Io *in_RDI;
  int unaff_retaddr;
  VP8StatusCode status;
  WebPDecBuffer *output;
  WebPDecParams *params;
  VP8Io *io;
  VP8Decoder *dec;
  undefined4 in_stack_ffffffffffffffc8;
  VP8StatusCode in_stack_ffffffffffffffcc;
  WebPIDecoder *idec_00;
  VP8Decoder *dec_00;
  WebPIDecoder *idec_01;
  VP8Io *io_00;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  VP8StatusCode VVar4;
  
  idec_01 = *(WebPIDecoder **)&in_RDI->crop_top;
  dec_00 = (VP8Decoder *)&in_RDI->mb_y;
  idec_00 = *(WebPIDecoder **)dec_00;
  io_00 = in_RDI;
  sVar3 = MemDataSize((MemBuffer *)&in_RDI[1].use_scaling);
  if (sVar3 < *(ulong *)&io_00[2].mb_h) {
    VVar4 = VP8_STATUS_SUSPENDED;
  }
  else {
    iVar1 = VP8GetHeaders((VP8Decoder *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),io_00);
    if (iVar1 == 0) {
      DVar2 = idec_01->state_;
      if ((DVar2 == STATE_VP8L_DATA) || (DVar2 == STATE_ERROR)) {
        VVar4 = VP8_STATUS_SUSPENDED;
      }
      else {
        VVar4 = IDecError(idec_00,DVar2);
      }
    }
    else {
      DVar2 = WebPAllocateDecBuffer
                        (unaff_retaddr,in_stack_fffffffffffffffc,(WebPDecoderOptions *)io_00,
                         (WebPDecBuffer *)idec_01);
      idec_01->state_ = DVar2;
      if (idec_01->state_ == STATE_WEBP_HEADER) {
        iVar1 = VP8GetThreadMethod((WebPDecoderOptions *)(dec_00->br_).buf_end_,
                                   (WebPHeaderStructure *)0x0,in_RDI->use_scaling,
                                   in_RDI->scaled_width);
        *(int *)&(idec_01->io_).put = iVar1;
        VP8InitDithering((WebPDecoderOptions *)CONCAT44(status,unaff_retaddr),
                         (VP8Decoder *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                        );
        DVar2 = CopyParts0Data(idec_01);
        idec_01->state_ = DVar2;
        if (idec_01->state_ == STATE_WEBP_HEADER) {
          VVar4 = VP8EnterCritical(dec_00,(VP8Io *)idec_00);
          if (VVar4 == VP8_STATUS_OK) {
            io_00->width = 3;
            iVar1 = VP8InitFrame((VP8Decoder *)
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                 (VP8Io *)0x10cb5b);
            if (iVar1 == 0) {
              VVar4 = IDecError(idec_00,in_stack_ffffffffffffffcc);
            }
            else {
              VVar4 = VP8_STATUS_OK;
            }
          }
          else {
            VVar4 = IDecError(idec_00,in_stack_ffffffffffffffcc);
          }
        }
        else {
          VVar4 = IDecError(idec_00,in_stack_ffffffffffffffcc);
        }
      }
      else {
        VVar4 = IDecError(idec_00,in_stack_ffffffffffffffcc);
      }
    }
  }
  return VVar4;
}

Assistant:

static VP8StatusCode DecodePartition0(WebPIDecoder* const idec) {
  VP8Decoder* const dec = (VP8Decoder*)idec->dec_;
  VP8Io* const io = &idec->io_;
  const WebPDecParams* const params = &idec->params_;
  WebPDecBuffer* const output = params->output;

  // Wait till we have enough data for the whole partition #0
  if (MemDataSize(&idec->mem_) < idec->mem_.part0_size_) {
    return VP8_STATUS_SUSPENDED;
  }

  if (!VP8GetHeaders(dec, io)) {
    const VP8StatusCode status = dec->status_;
    if (status == VP8_STATUS_SUSPENDED ||
        status == VP8_STATUS_NOT_ENOUGH_DATA) {
      // treating NOT_ENOUGH_DATA as SUSPENDED state
      return VP8_STATUS_SUSPENDED;
    }
    return IDecError(idec, status);
  }

  // Allocate/Verify output buffer now
  dec->status_ = WebPAllocateDecBuffer(io->width, io->height, params->options,
                                       output);
  if (dec->status_ != VP8_STATUS_OK) {
    return IDecError(idec, dec->status_);
  }
  // This change must be done before calling VP8InitFrame()
  dec->mt_method_ = VP8GetThreadMethod(params->options, NULL,
                                       io->width, io->height);
  VP8InitDithering(params->options, dec);

  dec->status_ = CopyParts0Data(idec);
  if (dec->status_ != VP8_STATUS_OK) {
    return IDecError(idec, dec->status_);
  }

  // Finish setting up the decoding parameters. Will call io->setup().
  if (VP8EnterCritical(dec, io) != VP8_STATUS_OK) {
    return IDecError(idec, dec->status_);
  }

  // Note: past this point, teardown() must always be called
  // in case of error.
  idec->state_ = STATE_VP8_DATA;
  // Allocate memory and prepare everything.
  if (!VP8InitFrame(dec, io)) {
    return IDecError(idec, dec->status_);
  }
  return VP8_STATUS_OK;
}